

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O2

void ovf::detail::parse::ovf_file_action<ovf::detail::parse::version_number>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,char_const*>>>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>_>
                *in,ovf_file *file)

{
  int iVar1;
  string local_30;
  
  tao::pegtl::internal::
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,char_const*>>
  ::string_abi_cxx11_(&local_30,in);
  iVar1 = std::__cxx11::stoi(&local_30,(size_t *)0x0,10);
  file->version = iVar1;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & file )
        {
            file.version = std::stoi(in.string());
        }